

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall tinyusdz::crate::CrateReader::ReadTOC(CrateReader *this)

{
  uint64_t uVar1;
  StreamReader *this_00;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  char *pcVar10;
  char *pcVar11;
  unsigned_long *in_R8;
  pointer pSVar12;
  pointer __val;
  uint64_t num_sections;
  ostringstream ss_e;
  string local_228;
  string local_208;
  string local_1e8;
  int64_t *local_1c8;
  int64_t *local_1c0;
  int64_t *local_1b8;
  TableOfContents *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  uVar1 = this->_toc_offset;
  if (((long)uVar1 < 0x59) || (this_00 = this->_sr, (long)this_00->length_ <= (long)uVar1)) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
               ,0x56);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x1873);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
    pcVar10 = "Invalid toc offset.";
    lVar9 = 0x13;
LAB_001dd828:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar10,lVar9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_228._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == &local_228.field_2) goto LAB_001dd887;
  }
  else {
    this_00->idx_ = uVar1;
    local_1e8._M_dataplus._M_p = (pointer)0x0;
    bVar4 = StreamReader::read8(this_00,(uint64_t *)&local_1e8);
    if (!bVar4) {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x187f);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar10 = "Failed to read TOC(# of sections).";
      lVar9 = 0x22;
      goto LAB_001dd828;
    }
    if (local_1e8._M_dataplus._M_p < (pointer)(this->_config).maxTOCSections) {
      local_1b0 = &this->_toc;
      ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::resize
                (&local_1b0->sections,(size_type)local_1e8._M_dataplus._M_p);
      uVar7 = (long)local_1e8._M_dataplus._M_p * 0x20 + this->_memoryUsage;
      this->_memoryUsage = uVar7;
      if ((this->_config).maxMemoryBudget < uVar7) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x188a);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        pcVar10 = "Reached to max memory budget.";
        lVar9 = 0x1d;
        goto LAB_001dd828;
      }
      if (local_1e8._M_dataplus._M_p == (pointer)0x0) {
        return true;
      }
      local_1e8._M_string_length = (size_type)&this->_paths_index;
      local_1e8.field_2._M_allocated_capacity = (size_type)&this->_specs_index;
      local_1e8.field_2._8_8_ = &this->_fieldsets_index;
      local_1c8 = &this->_fields_index;
      local_1c0 = &this->_strings_index;
      local_1b8 = &this->_tokens_index;
      pSVar12 = (this->_toc).sections.
                super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = 0;
      __val = (pointer)0x0;
      while( true ) {
        bVar4 = ReadSection(this,(Section *)(pSVar12->name + lVar9));
        if (!bVar4) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x188e);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          ::std::__cxx11::to_string(&local_208,(unsigned_long)__val);
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_228,"Failed to read TOC section at ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_208);
          poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,local_228._M_dataplus._M_p,
                              local_228._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_001dda97;
          goto LAB_001ddaa4;
        }
        pSVar12 = (local_1b0->sections).
                  super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar7 = *(ulong *)(pSVar12->name + lVar9 + 0x10);
        if ((long)uVar7 < 0) break;
        uVar2 = *(ulong *)(pSVar12->name + lVar9 + 0x18);
        if ((long)uVar2 < 1) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x189a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          pcVar11 = "Invalid or empty section size.";
          pcVar10 = "";
          goto LAB_001de13f;
        }
        uVar3 = this->_sr->length_;
        if (uVar3 < uVar2) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x189e);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          pcVar11 = "Section size exceeds input USDC data size.";
          pcVar10 = "";
          goto LAB_001de13f;
        }
        if (uVar3 < uVar7) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x18a2);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          pcVar11 = "Section start byte offset exceeds input USDC data size.";
          pcVar10 = "";
          goto LAB_001de13f;
        }
        if (uVar3 < uVar2 + uVar7) {
          ::std::__cxx11::ostringstream::ostringstream(local_1a8);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
          poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x18ad);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          pcVar11 = "Section byte offset + size exceeds input USDC data size.";
          pcVar10 = "";
          goto LAB_001de13f;
        }
        pcVar10 = pSVar12->name + lVar9;
        iVar5 = strncmp(pcVar10,"TOKENS",0xf);
        uVar8 = local_1b8;
        if ((((iVar5 == 0) ||
             (iVar5 = strncmp(pcVar10,"STRINGS",0xf), uVar8 = local_1c0, iVar5 == 0)) ||
            (iVar5 = strncmp(pcVar10,"FIELDS",0xf), uVar8 = local_1c8, iVar5 == 0)) ||
           (((iVar5 = strncmp(pcVar10,"FIELDSETS",0xf), uVar8 = local_1e8.field_2._8_8_, iVar5 == 0
             || (iVar5 = strncmp(pcVar10,"SPECS",0xf),
                uVar8 = local_1e8.field_2._M_allocated_capacity, iVar5 == 0)) ||
            (iVar5 = strncmp(pcVar10,"PATHS",0xf), uVar8 = local_1e8._M_string_length, iVar5 == 0)))
           ) {
          *(pointer *)uVar8 = __val;
        }
        __val = __val + 1;
        lVar9 = lVar9 + 0x20;
        if (local_1e8._M_dataplus._M_p <= __val) {
          return true;
        }
      }
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x1896);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      pcVar11 = "Invalid section start byte offset.";
      pcVar10 = "";
LAB_001de13f:
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,pcVar11,pcVar10);
      fmt::format(&local_228,&local_208);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) goto LAB_001dda97;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadTOC",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar6 = (ostream *)::std::ostream::operator<<(local_1a8,0x1883);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_208,"# of sections {} are too large. maxTOCSections is set to {}",
                 "");
      fmt::format<unsigned_long,unsigned_long>
                (&local_228,(fmt *)&local_208,&local_1e8,&(this->_config).maxTOCSections,in_R8);
      poVar6 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_228._M_dataplus._M_p,local_228._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
LAB_001dda97:
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
    }
LAB_001ddaa4:
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_228._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p == &local_228.field_2) goto LAB_001dd887;
  }
  operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
LAB_001dd887:
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  ::std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool CrateReader::ReadTOC() {

  DCOUT(fmt::format("Memory budget: {} bytes", _config.maxMemoryBudget));

  if ((_toc_offset <= 88) || (_toc_offset >= int64_t(_sr->size()))) {
    PUSH_ERROR("Invalid toc offset.");
    return false;
  }

  if (!_sr->seek_set(uint64_t(_toc_offset))) {
    PUSH_ERROR("Failed to move to TOC offset.");
    return false;
  }

  // read # of sections.
  uint64_t num_sections{0};
  if (!_sr->read8(&num_sections)) {
    PUSH_ERROR("Failed to read TOC(# of sections).");
    return false;
  }
  if (num_sections >= _config.maxTOCSections) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("# of sections {} are too large. maxTOCSections is set to {}", num_sections, _config.maxTOCSections));
  }

  DCOUT("toc sections = " << num_sections);

  _toc.sections.resize(static_cast<size_t>(num_sections));

  CHECK_MEMORY_USAGE(num_sections * sizeof(Section));

  for (size_t i = 0; i < num_sections; i++) {
    if (!ReadSection(&_toc.sections[i])) {
      PUSH_ERROR("Failed to read TOC section at " + std::to_string(i));
      return false;
    }
    DCOUT("section[" << i << "] name = " << _toc.sections[i].name
                     << ", start = " << _toc.sections[i].start
                     << ", size = " << _toc.sections[i].size);

    if (_toc.sections[i].start < 0) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Invalid section start byte offset."));
    }

    if (_toc.sections[i].size <= 0) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Invalid or empty section size."));
    }

    if (size_t(_toc.sections[i].size) > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section size exceeds input USDC data size."));
    }

    if (size_t(_toc.sections[i].start) > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section start byte offset exceeds input USDC data size."));
    }

    // TODO: handle integer overflow.
    size_t end_offset = size_t(_toc.sections[i].start + _toc.sections[i].size);
    if (sizeof(void *) == 4) { // 32bit
      if (end_offset > size_t(std::numeric_limits<int32_t>::max())) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section end offset exceeds 32bit max."));
      }
    }
    if (end_offset > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section byte offset + size exceeds input USDC data size."));
    }


    if (0 == strncmp(_toc.sections[i].name, "TOKENS",
                     crate::kSectionNameMaxLength)) {
      _tokens_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "STRINGS",
                            crate::kSectionNameMaxLength)) {
      _strings_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "FIELDS",
                            crate::kSectionNameMaxLength)) {
      _fields_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "FIELDSETS",
                            crate::kSectionNameMaxLength)) {
      _fieldsets_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "SPECS",
                            crate::kSectionNameMaxLength)) {
      _specs_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "PATHS",
                            crate::kSectionNameMaxLength)) {
      _paths_index = int64_t(i);
    }
  }

  DCOUT("TOC read success");
  return true;
}